

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *
__thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
operator[]<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *name)

{
  MemberIterator member;
  long local_10;
  
  FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)&local_10,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this);
  if (*(short *)(this + 0xe) != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/document.h"
                  ,0x473,
                  "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberEnd() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  if (local_10 != (ulong)*(uint *)this * 0x20 + (*(ulong *)(this + 8) & 0xffffffffffff)) {
    return (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)(local_10 + 0x10);
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/document.h"
                ,0x454,
                "GenericValue<Encoding, Allocator> &rapidjson::GenericValue<rapidjson::UTF8<>>::operator[](const GenericValue<Encoding, SourceAllocator> &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, SourceAllocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

GenericValue& operator[](const GenericValue<Encoding, SourceAllocator>& name) {
        MemberIterator member = FindMember(name);
        if (member != MemberEnd())
            return member->value;
        else {
            RAPIDJSON_ASSERT(false);    // see above note

            // This will generate -Wexit-time-destructors in clang
            // static GenericValue NullValue;
            // return NullValue;

            // Use static buffer and placement-new to prevent destruction
            static char buffer[sizeof(GenericValue)];
            return *new (buffer) GenericValue();
        }
    }